

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O0

void JPCommonLabel_push_word
               (JPCommonLabel *label,char *pron,char *pos,char *ctype,char *cform,int acc,
               int chain_flag)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  JPCommonLabelWord *in_RCX;
  JPCommonLabelWord *in_RDX;
  JPCommonLabelWord *in_RSI;
  long in_RDI;
  undefined4 in_R9D;
  int in_stack_00000008;
  int is_first_word;
  int find;
  int i;
  JPCommonLabelMora *in_stack_ffffffffffffffa8;
  JPCommonLabelMora *in_stack_ffffffffffffffb0;
  JPCommonLabelWord *in_stack_ffffffffffffffb8;
  JPCommonLabelPhoneme *in_stack_ffffffffffffffc0;
  int iVar4;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  
  iVar4 = 1;
  iVar1 = strcmp((char *)in_RSI,anon_var_dwarf_1cc4);
  if (iVar1 == 0) {
    *(undefined4 *)(in_RDI + 0x60) = 1;
  }
  else {
    iVar1 = strcmp((char *)in_RSI,anon_var_dwarf_14fa);
    if (iVar1 == 0) {
      if (*(long *)(in_RDI + 0x58) == 0) {
        fprintf(_stderr,
                "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: First mora should not be question flag.\n"
               );
      }
      else {
        iVar1 = strcmp((char *)**(undefined8 **)(in_RDI + 0x58),"pau");
        if (iVar1 == 0) {
          if (*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x58) + 8) + 0x18
                                                     ) + 0x28) + 0x40) + 8) == 0) {
            pcVar2 = strdup("1");
            *(char **)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x58) + 8) + 0x18)
                                          + 0x28) + 0x40) + 8) = pcVar2;
          }
        }
        else if (*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x58) + 0x18) + 0x28) +
                                    0x40) + 8) == 0) {
          pcVar2 = strdup("1");
          *(char **)(*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x58) + 0x18) + 0x28) + 0x40)
                    + 8) = pcVar2;
        }
      }
      *(undefined4 *)(in_RDI + 0x60) = 1;
    }
    else {
      while (*(char *)&in_RSI->pron != '\0') {
        in_stack_ffffffffffffffcc = strtopcmp((char *)in_RSI,anon_var_dwarf_b43f7 + 6);
        if (in_stack_ffffffffffffffcc == -1) {
          in_stack_ffffffffffffffcc = strtopcmp((char *)in_RSI,anon_var_dwarf_131a);
          if (in_stack_ffffffffffffffcc == -1) {
            in_stack_ffffffffffffffd0 = 0;
            while ((jpcommon_mora_list[in_stack_ffffffffffffffd0] != (char *)0x0 &&
                   (in_stack_ffffffffffffffcc =
                         strtopcmp((char *)in_RSI,jpcommon_mora_list[in_stack_ffffffffffffffd0]),
                   in_stack_ffffffffffffffcc == -1))) {
              in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + 3;
            }
            if (in_stack_ffffffffffffffcc == -1) {
              fprintf(_stderr,
                      "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: %s is wrong mora list.\n"
                      ,in_RSI);
              break;
            }
            if (*(long *)(in_RDI + 0x58) == 0) {
              JPCommonLabel_insert_pause((JPCommonLabel *)0x187b98);
              pvVar3 = calloc(1,0x20);
              *(void **)(in_RDI + 0x58) = pvVar3;
              pvVar3 = calloc(1,0x30);
              *(void **)(in_RDI + 0x48) = pvVar3;
              pvVar3 = calloc(1,0x48);
              *(void **)(in_RDI + 0x38) = pvVar3;
              JPCommonLabelPhoneme_initialize
                        (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                         (JPCommonLabelPhoneme *)in_stack_ffffffffffffffb0,
                         (JPCommonLabelPhoneme *)in_stack_ffffffffffffffa8,
                         (JPCommonLabelMora *)0x187c1c);
              JPCommonLabelMora_initialize
                        ((JPCommonLabelMora *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                         (char *)CONCAT44(in_stack_ffffffffffffffcc,iVar4),in_stack_ffffffffffffffc0
                         ,(JPCommonLabelPhoneme *)in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0,*(JPCommonLabelMora **)(in_RDI + 0x38),in_RCX);
              in_stack_ffffffffffffffa8 = *(JPCommonLabelMora **)(in_RDI + 0x48);
              in_stack_ffffffffffffffb0 = (JPCommonLabelMora *)0x0;
              in_stack_ffffffffffffffb8 = (JPCommonLabelWord *)0x0;
              JPCommonLabelWord_initialize
                        ((JPCommonLabelWord *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                         (char *)CONCAT44(in_stack_ffffffffffffffcc,iVar4),
                         (char *)in_stack_ffffffffffffffc0,(char *)0x0,(char *)0x0,
                         in_stack_ffffffffffffffa8,(JPCommonLabelMora *)in_RCX,in_RDX,in_RSI);
              *(undefined8 *)(in_RDI + 0x50) = *(undefined8 *)(in_RDI + 0x58);
              *(undefined8 *)(in_RDI + 0x40) = *(undefined8 *)(in_RDI + 0x48);
              *(undefined8 *)(in_RDI + 0x30) = *(undefined8 *)(in_RDI + 0x38);
              iVar4 = 0;
            }
            else if (iVar4 == 1) {
              JPCommonLabel_insert_pause((JPCommonLabel *)0x187d07);
              pvVar3 = calloc(1,0x20);
              *(void **)(*(long *)(in_RDI + 0x58) + 0x10) = pvVar3;
              pvVar3 = calloc(1,0x30);
              *(void **)(*(long *)(in_RDI + 0x48) + 0x20) = pvVar3;
              pvVar3 = calloc(1,0x48);
              *(void **)(*(long *)(in_RDI + 0x38) + 0x38) = pvVar3;
              JPCommonLabelPhoneme_initialize
                        (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                         (JPCommonLabelPhoneme *)in_stack_ffffffffffffffb0,
                         (JPCommonLabelPhoneme *)in_stack_ffffffffffffffa8,
                         (JPCommonLabelMora *)0x187da5);
              JPCommonLabelMora_initialize
                        ((JPCommonLabelMora *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                         (char *)CONCAT44(in_stack_ffffffffffffffcc,iVar4),in_stack_ffffffffffffffc0
                         ,(JPCommonLabelPhoneme *)in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0,
                         *(JPCommonLabelMora **)(*(long *)(in_RDI + 0x38) + 0x38),in_RCX);
              in_stack_ffffffffffffffa8 = *(JPCommonLabelMora **)(*(long *)(in_RDI + 0x48) + 0x20);
              in_stack_ffffffffffffffb0 = *(JPCommonLabelMora **)(in_RDI + 0x38);
              in_stack_ffffffffffffffb8 = (JPCommonLabelWord *)0x0;
              JPCommonLabelWord_initialize
                        ((JPCommonLabelWord *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                         (char *)CONCAT44(in_stack_ffffffffffffffcc,iVar4),
                         (char *)in_stack_ffffffffffffffc0,(char *)0x0,
                         (char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                         (JPCommonLabelMora *)in_RCX,in_RDX,in_RSI);
              *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)(*(long *)(in_RDI + 0x58) + 0x10);
              *(undefined8 *)(in_RDI + 0x48) = *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x20);
              *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(*(long *)(in_RDI + 0x38) + 0x38);
              iVar4 = 0;
            }
            else {
              JPCommonLabel_insert_pause((JPCommonLabel *)0x187eb5);
              pvVar3 = calloc(1,0x20);
              *(void **)(*(long *)(in_RDI + 0x58) + 0x10) = pvVar3;
              pvVar3 = calloc(1,0x30);
              *(void **)(*(long *)(in_RDI + 0x48) + 0x20) = pvVar3;
              JPCommonLabelPhoneme_initialize
                        (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                         (JPCommonLabelPhoneme *)in_stack_ffffffffffffffb0,
                         (JPCommonLabelPhoneme *)in_stack_ffffffffffffffa8,
                         (JPCommonLabelMora *)0x187f34);
              in_stack_ffffffffffffffa8 = *(JPCommonLabelMora **)(*(long *)(in_RDI + 0x48) + 0x28);
              JPCommonLabelMora_initialize
                        ((JPCommonLabelMora *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                         (char *)CONCAT44(in_stack_ffffffffffffffcc,iVar4),in_stack_ffffffffffffffc0
                         ,(JPCommonLabelPhoneme *)in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RCX);
              *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)(*(long *)(in_RDI + 0x58) + 0x10);
              *(undefined8 *)(in_RDI + 0x48) = *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x20);
              *(undefined8 *)(*(long *)(in_RDI + 0x38) + 0x28) = *(undefined8 *)(in_RDI + 0x48);
            }
            if (jpcommon_mora_list[in_stack_ffffffffffffffd0 + 2] != (char *)0x0) {
              JPCommonLabel_insert_pause((JPCommonLabel *)0x187ff7);
              pvVar3 = calloc(1,0x20);
              *(void **)(*(long *)(in_RDI + 0x58) + 0x10) = pvVar3;
              JPCommonLabelPhoneme_initialize
                        (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                         (JPCommonLabelPhoneme *)in_stack_ffffffffffffffb0,
                         (JPCommonLabelPhoneme *)in_stack_ffffffffffffffa8,
                         (JPCommonLabelMora *)0x188053);
              *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)(*(long *)(in_RDI + 0x58) + 0x10);
              *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x10) = *(undefined8 *)(in_RDI + 0x58);
            }
            in_RSI = (JPCommonLabelWord *)((long)&in_RSI->pron + (long)in_stack_ffffffffffffffcc);
          }
          else {
            if ((*(long *)(in_RDI + 0x58) == 0) || (iVar4 == 1)) {
              fprintf(_stderr,
                      "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: First mora should not be unvoice flag.\n"
                     );
            }
            else {
              JPCommonLabelPhoneme_convert_unvoice
                        ((JPCommonLabelPhoneme *)in_stack_ffffffffffffffb0);
            }
            in_RSI = (JPCommonLabelWord *)((long)&in_RSI->pron + (long)in_stack_ffffffffffffffcc);
          }
        }
        else {
          if ((*(long *)(in_RDI + 0x58) == 0) || (*(int *)(in_RDI + 0x60) != 0)) {
            fprintf(_stderr,
                    "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: First mora should not be long vowel symbol.\n"
                   );
          }
          else {
            JPCommonLabel_insert_pause((JPCommonLabel *)0x187977);
            pvVar3 = calloc(1,0x20);
            *(void **)(*(long *)(in_RDI + 0x58) + 0x10) = pvVar3;
            pvVar3 = calloc(1,0x30);
            *(void **)(*(long *)(in_RDI + 0x48) + 0x20) = pvVar3;
            JPCommonLabelPhoneme_initialize
                      (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                       (JPCommonLabelPhoneme *)in_stack_ffffffffffffffb0,
                       (JPCommonLabelPhoneme *)in_stack_ffffffffffffffa8,
                       (JPCommonLabelMora *)0x1879ed);
            in_stack_ffffffffffffffa8 = *(JPCommonLabelMora **)(*(long *)(in_RDI + 0x48) + 0x28);
            JPCommonLabelMora_initialize
                      ((JPCommonLabelMora *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                       (char *)CONCAT44(in_stack_ffffffffffffffcc,iVar4),in_stack_ffffffffffffffc0,
                       (JPCommonLabelPhoneme *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                       in_stack_ffffffffffffffa8,in_RCX);
            *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)(*(long *)(in_RDI + 0x58) + 0x10);
            *(undefined8 *)(in_RDI + 0x48) = *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x20);
            *(undefined8 *)(*(long *)(in_RDI + 0x38) + 0x28) = *(undefined8 *)(in_RDI + 0x48);
          }
          in_RSI = (JPCommonLabelWord *)((long)&in_RSI->pron + (long)in_stack_ffffffffffffffcc);
        }
      }
      if (((iVar4 != 1) && (*(long *)(in_RDI + 0x58) != 0)) &&
         (iVar1 = strcmp((char *)**(undefined8 **)(in_RDI + 0x58),"pau"), iVar1 != 0)) {
        if (*(long *)(in_RDI + 0x30) == *(long *)(in_RDI + 0x38)) {
          pvVar3 = calloc(1,0x38);
          *(void **)(in_RDI + 0x28) = pvVar3;
          pvVar3 = calloc(1,0x20);
          *(void **)(in_RDI + 0x18) = pvVar3;
          *(undefined8 *)(*(long *)(in_RDI + 0x38) + 0x40) = *(undefined8 *)(in_RDI + 0x28);
          JPCommonLabelAccentPhrase_initialize
                    ((JPCommonLabelAccentPhrase *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc,(char *)in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8,*(JPCommonLabelWord **)(in_RDI + 0x18),
                     (JPCommonLabelAccentPhrase *)0x0,(JPCommonLabelAccentPhrase *)in_RCX,
                     (JPCommonLabelBreathGroup *)in_RDX);
          JPCommonLabelBreathGroup_initialize
                    (*(JPCommonLabelBreathGroup **)(in_RDI + 0x18),
                     *(JPCommonLabelAccentPhrase **)(in_RDI + 0x28),
                     *(JPCommonLabelAccentPhrase **)(in_RDI + 0x28),(JPCommonLabelBreathGroup *)0x0,
                     (JPCommonLabelBreathGroup *)0x0);
          *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(in_RDI + 0x28);
          *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RDI + 0x18);
        }
        else if (in_stack_00000008 == 1) {
          *(undefined8 *)(*(long *)(in_RDI + 0x38) + 0x40) = *(undefined8 *)(in_RDI + 0x28);
          *(undefined8 *)(*(long *)(in_RDI + 0x28) + 0x18) = *(undefined8 *)(in_RDI + 0x38);
        }
        else {
          iVar1 = strcmp((char *)**(undefined8 **)
                                   (*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x38) + 0x30) +
                                                       0x28) + 0x10) + 0x10),"pau");
          if (iVar1 == 0) {
            pvVar3 = calloc(1,0x38);
            *(void **)(*(long *)(in_RDI + 0x28) + 0x28) = pvVar3;
            pvVar3 = calloc(1,0x20);
            *(void **)(*(long *)(in_RDI + 0x18) + 0x18) = pvVar3;
            *(undefined8 *)(*(long *)(in_RDI + 0x38) + 0x40) =
                 *(undefined8 *)(*(long *)(in_RDI + 0x28) + 0x28);
            JPCommonLabelAccentPhrase_initialize
                      ((JPCommonLabelAccentPhrase *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc,(char *)in_stack_ffffffffffffffc0,
                       in_stack_ffffffffffffffb8,
                       *(JPCommonLabelWord **)(*(long *)(in_RDI + 0x18) + 0x18),
                       (JPCommonLabelAccentPhrase *)0x0,(JPCommonLabelAccentPhrase *)in_RCX,
                       (JPCommonLabelBreathGroup *)in_RDX);
            JPCommonLabelBreathGroup_initialize
                      (*(JPCommonLabelBreathGroup **)(*(long *)(in_RDI + 0x18) + 0x18),
                       *(JPCommonLabelAccentPhrase **)(*(long *)(in_RDI + 0x28) + 0x28),
                       *(JPCommonLabelAccentPhrase **)(*(long *)(in_RDI + 0x28) + 0x28),
                       *(JPCommonLabelBreathGroup **)(in_RDI + 0x18),(JPCommonLabelBreathGroup *)0x0
                      );
            *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(*(long *)(in_RDI + 0x28) + 0x28);
            *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x18);
          }
          else {
            pvVar3 = calloc(1,0x38);
            *(void **)(*(long *)(in_RDI + 0x28) + 0x28) = pvVar3;
            *(undefined8 *)(*(long *)(in_RDI + 0x38) + 0x40) =
                 *(undefined8 *)(*(long *)(in_RDI + 0x28) + 0x28);
            JPCommonLabelAccentPhrase_initialize
                      ((JPCommonLabelAccentPhrase *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc,(char *)in_stack_ffffffffffffffc0,
                       in_stack_ffffffffffffffb8,*(JPCommonLabelWord **)(in_RDI + 0x18),
                       (JPCommonLabelAccentPhrase *)0x0,(JPCommonLabelAccentPhrase *)in_RCX,
                       (JPCommonLabelBreathGroup *)in_RDX);
            *(undefined8 *)(*(long *)(in_RDI + 0x18) + 8) =
                 *(undefined8 *)(*(long *)(in_RDI + 0x28) + 0x28);
            *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(*(long *)(in_RDI + 0x28) + 0x28);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void JPCommonLabel_push_word(JPCommonLabel * label, const char *pron, const char *pos,
                             const char *ctype, const char *cform, int acc, int chain_flag)
{
   int i;
   int find;
   int is_first_word = 1;

   if (strcmp(pron, JPCOMMON_MORA_SHORT_PAUSE) == 0) {
      label->short_pause_flag = 1;
      return;
   }

   /* set emotion flag */
   if (strcmp(pron, JPCOMMON_MORA_QUESTION) == 0) {
      if (label->phoneme_tail != NULL) {
         if (strcmp(label->phoneme_tail->phoneme, JPCOMMON_PHONEME_SHORT_PAUSE) == 0) {
            if (label->phoneme_tail->prev->up->up->up->emotion == NULL)
               label->phoneme_tail->prev->up->up->up->emotion = strdup(JPCOMMON_FLAG_QUESTION);
         } else {
            if (label->phoneme_tail->up->up->up->emotion == NULL)
               label->phoneme_tail->up->up->up->emotion = strdup(JPCOMMON_FLAG_QUESTION);
         }
      } else {
         fprintf(stderr,
                 "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: First mora should not be question flag.\n");
      }
      label->short_pause_flag = 1;
      return;
   }

   /* analysis pron */
   while (pron[0] != '\0') {
      find = strtopcmp(pron, JPCOMMON_MORA_LONG_VOWEL);
      if (find != -1) {
         /* for long vowel */
         if (label->phoneme_tail != NULL && label->short_pause_flag == 0) {
            JPCommonLabel_insert_pause(label);
            label->phoneme_tail->next =
                (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
            label->mora_tail->next = (JPCommonLabelMora *) calloc(1, sizeof(JPCommonLabelMora));
            JPCommonLabelPhoneme_initialize(label->phoneme_tail->next, label->phoneme_tail->phoneme,
                                            label->phoneme_tail, NULL, label->mora_tail->next);
            JPCommonLabelMora_initialize(label->mora_tail->next, JPCOMMON_MORA_LONG_VOWEL,
                                         label->phoneme_tail->next, label->phoneme_tail->next,
                                         label->mora_tail, NULL, label->mora_tail->up);
            label->phoneme_tail = label->phoneme_tail->next;
            label->mora_tail = label->mora_tail->next;
            label->word_tail->tail = label->mora_tail;
         } else {
            fprintf(stderr,
                    "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: First mora should not be long vowel symbol.\n");
         }
         pron += find;
      } else {
         find = strtopcmp(pron, JPCOMMON_MORA_UNVOICE);
         if (find != -1) {
            /* for unvoice */
            if (label->phoneme_tail != NULL && is_first_word != 1)
               JPCommonLabelPhoneme_convert_unvoice(label->phoneme_tail);
            else
               fprintf(stderr,
                       "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: First mora should not be unvoice flag.\n");
            pron += find;
         } else {
            /* for normal word */
            for (i = 0; jpcommon_mora_list[i] != NULL; i += 3) {
               find = strtopcmp(pron, jpcommon_mora_list[i]);
               if (find != -1)
                  break;
            }
            if (find != -1) {
               if (label->phoneme_tail == NULL) {
                  JPCommonLabel_insert_pause(label);
                  label->phoneme_tail =
                      (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
                  label->mora_tail = (JPCommonLabelMora *) calloc(1, sizeof(JPCommonLabelMora));
                  label->word_tail = (JPCommonLabelWord *) calloc(1, sizeof(JPCommonLabelWord));
                  JPCommonLabelPhoneme_initialize(label->phoneme_tail, jpcommon_mora_list[i + 1],
                                                  NULL, NULL, label->mora_tail);
                  JPCommonLabelMora_initialize(label->mora_tail, jpcommon_mora_list[i],
                                               label->phoneme_tail, label->phoneme_tail, NULL, NULL,
                                               label->word_tail);
                  JPCommonLabelWord_initialize(label->word_tail, pron, pos, ctype, cform,
                                               label->mora_tail, label->mora_tail, NULL, NULL);
                  label->phoneme_head = label->phoneme_tail;
                  label->mora_head = label->mora_tail;
                  label->word_head = label->word_tail;
                  is_first_word = 0;
               } else {
                  if (is_first_word == 1) {
                     JPCommonLabel_insert_pause(label);
                     label->phoneme_tail->next =
                         (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
                     label->mora_tail->next =
                         (JPCommonLabelMora *) calloc(1, sizeof(JPCommonLabelMora));
                     label->word_tail->next =
                         (JPCommonLabelWord *) calloc(1, sizeof(JPCommonLabelWord));
                     JPCommonLabelPhoneme_initialize(label->phoneme_tail->next,
                                                     jpcommon_mora_list[i + 1], label->phoneme_tail,
                                                     NULL, label->mora_tail->next);
                     JPCommonLabelMora_initialize(label->mora_tail->next, jpcommon_mora_list[i],
                                                  label->phoneme_tail->next,
                                                  label->phoneme_tail->next, label->mora_tail, NULL,
                                                  label->word_tail->next);
                     JPCommonLabelWord_initialize(label->word_tail->next, pron, pos, ctype, cform,
                                                  label->mora_tail->next, label->mora_tail->next,
                                                  label->word_tail, NULL);
                     label->phoneme_tail = label->phoneme_tail->next;
                     label->mora_tail = label->mora_tail->next;
                     label->word_tail = label->word_tail->next;
                     is_first_word = 0;
                  } else {
                     JPCommonLabel_insert_pause(label);
                     label->phoneme_tail->next =
                         (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
                     label->mora_tail->next =
                         (JPCommonLabelMora *) calloc(1, sizeof(JPCommonLabelMora));
                     JPCommonLabelPhoneme_initialize(label->phoneme_tail->next,
                                                     jpcommon_mora_list[i + 1], label->phoneme_tail,
                                                     NULL, label->mora_tail->next);
                     JPCommonLabelMora_initialize(label->mora_tail->next, jpcommon_mora_list[i],
                                                  label->phoneme_tail->next,
                                                  label->phoneme_tail->next, label->mora_tail, NULL,
                                                  label->mora_tail->up);
                     label->phoneme_tail = label->phoneme_tail->next;
                     label->mora_tail = label->mora_tail->next;
                     label->word_tail->tail = label->mora_tail;
                  }
               }
               if (jpcommon_mora_list[i + 2] != NULL) {
                  JPCommonLabel_insert_pause(label);
                  label->phoneme_tail->next =
                      (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
                  JPCommonLabelPhoneme_initialize(label->phoneme_tail->next,
                                                  jpcommon_mora_list[i + 2], label->phoneme_tail,
                                                  NULL, label->mora_tail);
                  label->phoneme_tail = label->phoneme_tail->next;
                  label->mora_tail->tail = label->phoneme_tail;
               }
               pron += find;
            } else {
               fprintf(stderr,
                       "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: %s is wrong mora list.\n",
                       pron);
               break;
            }
         }
      }
   }

   /* check */
   if (is_first_word == 1)
      return;
   if (label->phoneme_tail == NULL)
      return;
   if (strcmp(label->phoneme_tail->phoneme, JPCOMMON_PHONEME_SHORT_PAUSE) == 0)
      return;

   /* make accent, phrase */
   if (label->word_head == label->word_tail) {
      /* first word */
      label->accent_tail =
          (JPCommonLabelAccentPhrase *) calloc(1, sizeof(JPCommonLabelAccentPhrase));

      label->breath_tail = (JPCommonLabelBreathGroup *) calloc(1, sizeof(JPCommonLabelBreathGroup));
      label->word_tail->up = label->accent_tail;
      JPCommonLabelAccentPhrase_initialize(label->accent_tail, acc, NULL, label->word_tail,
                                           label->word_tail, NULL, NULL, label->breath_tail);
      JPCommonLabelBreathGroup_initialize(label->breath_tail, label->accent_tail,
                                          label->accent_tail, NULL, NULL);
      label->accent_head = label->accent_tail;
      label->breath_head = label->breath_tail;
   } else if (chain_flag == 1) {
      /* common accent phrase and common phrase */
      label->word_tail->up = label->accent_tail;
      label->accent_tail->tail = label->word_tail;
   } else
       if (strcmp(label->word_tail->prev->tail->tail->next->phoneme, JPCOMMON_PHONEME_SHORT_PAUSE)
           != 0) {
      /* different accent phrase && common phrase */
      label->accent_tail->next =
          (JPCommonLabelAccentPhrase *) calloc(1, sizeof(JPCommonLabelAccentPhrase));
      label->word_tail->up = label->accent_tail->next;
      JPCommonLabelAccentPhrase_initialize(label->accent_tail->next, acc, NULL, label->word_tail,
                                           label->word_tail, label->accent_tail, NULL,
                                           label->breath_tail);
      label->breath_tail->tail = label->accent_tail->next;
      label->accent_tail = label->accent_tail->next;
   } else {
      /* different accent phrase && different phrase */
      label->accent_tail->next =
          (JPCommonLabelAccentPhrase *) calloc(1, sizeof(JPCommonLabelAccentPhrase));
      label->breath_tail->next =
          (JPCommonLabelBreathGroup *) calloc(1, sizeof(JPCommonLabelBreathGroup));
      label->word_tail->up = label->accent_tail->next;
      JPCommonLabelAccentPhrase_initialize(label->accent_tail->next, acc, NULL, label->word_tail,
                                           label->word_tail, label->accent_tail, NULL,
                                           label->breath_tail->next);
      JPCommonLabelBreathGroup_initialize(label->breath_tail->next, label->accent_tail->next,
                                          label->accent_tail->next, label->breath_tail, NULL);
      label->accent_tail = label->accent_tail->next;
      label->breath_tail = label->breath_tail->next;
   }
}